

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

duckdb_data_chunk duckdb_result_get_chunk(duckdb_result result,idx_t chunk_idx)

{
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> _Var1;
  pointer pQVar2;
  MaterializedQueryResult *this;
  ColumnDataCollection *this_00;
  idx_t iVar3;
  pointer this_01;
  Allocator *allocator;
  type result_00;
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_20;
  
  if (((result.internal_data != (void *)0x0) &&
      (*(char *)((long)result.internal_data + 8) != '\x03')) &&
     (pQVar2 = duckdb::
               unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
               operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.internal_data),
     (pQVar2->super_BaseQueryResult).type == MATERIALIZED_RESULT)) {
    *(undefined1 *)((long)result.internal_data + 8) = 1;
    this = (MaterializedQueryResult *)
           duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)result.internal_data);
    this_00 = duckdb::MaterializedQueryResult::Collection(this);
    iVar3 = duckdb::ColumnDataCollection::ChunkCount(this_00);
    if (chunk_idx < iVar3) {
      duckdb::make_uniq<duckdb::DataChunk>();
      this_01 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)&local_20);
      allocator = duckdb::Allocator::DefaultAllocator();
      duckdb::DataChunk::Initialize(this_01,allocator,&this_00->types,0x800);
      result_00 = duckdb::
                  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_20);
      duckdb::ColumnDataCollection::FetchChunk(this_00,chunk_idx,result_00);
      _Var1._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           local_20._M_t.
           super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
           super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
      local_20._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           (tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)
           (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0;
      std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_20
                );
      return (duckdb_data_chunk)
             (DataChunk *)
             _Var1._M_t.
             super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
             super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    }
  }
  return (duckdb_data_chunk)0x0;
}

Assistant:

duckdb_data_chunk duckdb_result_get_chunk(duckdb_result result, idx_t chunk_idx) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *(reinterpret_cast<duckdb::DuckDBResultData *>(result.internal_data));
	if (result_data.result_set_type == duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_DEPRECATED) {
		return nullptr;
	}
	if (result_data.result->type != duckdb::QueryResultType::MATERIALIZED_RESULT) {
		// This API is only supported for materialized query results
		return nullptr;
	}
	result_data.result_set_type = duckdb::CAPIResultSetType::CAPI_RESULT_TYPE_MATERIALIZED;
	auto &materialized = reinterpret_cast<duckdb::MaterializedQueryResult &>(*result_data.result);
	auto &collection = materialized.Collection();
	if (chunk_idx >= collection.ChunkCount()) {
		return nullptr;
	}
	auto chunk = duckdb::make_uniq<duckdb::DataChunk>();
	chunk->Initialize(duckdb::Allocator::DefaultAllocator(), collection.Types());
	collection.FetchChunk(chunk_idx, *chunk);
	return reinterpret_cast<duckdb_data_chunk>(chunk.release());
}